

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O3

bool tinyusdz::ACEScg_to_linear_sRGB
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,vector<float,_std::allocator<float>_> *out_img,string *err)

{
  ostringstream *poVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  string *psVar6;
  ostream *poVar7;
  long lVar8;
  pointer pfVar9;
  pointer pfVar10;
  pointer pcVar11;
  pointer __new_size;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ostringstream ss_e;
  string local_208;
  string *local_1e8;
  string local_1e0;
  size_t local_1c0;
  unsigned_long local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c0 = channels;
  if (width == 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<(poVar1,0x3a2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar12 = "width is zero.";
    lVar8 = 0xe;
LAB_0044ee5a:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),pcVar12,lVar8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"\n",1);
    if (err == (string *)0x0) goto LAB_0044eeb4;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_0044eeb4;
  }
  else {
    if (height == 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<(poVar1,0x3a6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar12 = "height is zero.";
      lVar8 = 0xf;
      goto LAB_0044ee5a;
    }
    if (channels == 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<(poVar1,0x3aa);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar12 = "channels is zero.";
      lVar8 = 0x11;
      goto LAB_0044ee5a;
    }
    if (channels - 5 < 0xfffffffffffffffe) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<(poVar1,0x3ae);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"channels must be 3 or 4, but got {}","");
      fmt::format<unsigned_long>(&local_208,&local_1e0,&local_1c0);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (err == (string *)0x0) goto LAB_0044eeb4;
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_0044eeb4;
    }
    else {
      if (out_img == (vector<float,_std::allocator<float>_> *)0x0) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        ::std::__cxx11::ostringstream::ostringstream(poVar1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                   ,0x54);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<(poVar1,0x3b2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar12 = "`out_img` is nullptr.";
        lVar8 = 0x15;
        goto LAB_0044ee5a;
      }
      __new_size = (pointer)((long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
      pcVar11 = (pointer)(height * width * channels);
      local_1e8 = err;
      if (__new_size == pcVar11) {
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,(size_type)__new_size);
        pfVar9 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar10 = (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (channels == 3) {
          pfVar10 = pfVar10 + 2;
          pfVar9 = pfVar9 + 2;
          sVar13 = 0;
          do {
            lVar8 = 0;
            sVar14 = width;
            do {
              fVar2 = *(float *)((long)pfVar9 + lVar8);
              uVar4 = *(undefined8 *)((long)pfVar9 + lVar8 + -8);
              fVar16 = (float)uVar4;
              fVar17 = (float)((ulong)uVar4 >> 0x20);
              fVar18 = fVar17 * 0.621792;
              fVar19 = fVar2 * 1.152972 + (fVar16 * -0.024004 - fVar17 * 0.128969);
              fVar17 = 0.0;
              if (0.0 <= fVar19) {
                fVar17 = fVar19;
              }
              auVar5._4_4_ = fVar16 * -0.130257 + fVar2 * -0.012033211;
              auVar5._0_4_ = (fVar16 * 1.705052 - fVar18) + fVar2 * -0.083258;
              auVar5._8_4_ = (0.0 - fVar18) + fVar2 * 0.0;
              auVar5._12_4_ = (0.0 - fVar18) + fVar2 * 0.0;
              auVar15 = maxps(ZEXT816(0),auVar5);
              *(long *)((long)pfVar10 + lVar8 + -8) = auVar15._0_8_;
              *(float *)((long)pfVar10 + lVar8) = fVar17;
              lVar8 = lVar8 + 0xc;
              sVar14 = sVar14 - 1;
            } while (sVar14 != 0);
            sVar13 = sVar13 + 1;
            pfVar10 = pfVar10 + width * 3;
            pfVar9 = pfVar9 + width * 3;
          } while (sVar13 != height);
          return true;
        }
        pfVar10 = pfVar10 + 3;
        pfVar9 = pfVar9 + 3;
        sVar13 = 0;
        do {
          lVar8 = 0;
          sVar14 = width;
          do {
            fVar2 = *(float *)((long)pfVar9 + lVar8 + -4);
            uVar3 = *(undefined4 *)((long)pfVar9 + lVar8);
            uVar4 = *(undefined8 *)((long)pfVar9 + lVar8 + -0xc);
            fVar16 = (float)uVar4;
            fVar17 = (float)((ulong)uVar4 >> 0x20);
            fVar18 = fVar17 * 0.621792;
            fVar19 = fVar2 * 1.152972 + (fVar16 * -0.024004 - fVar17 * 0.128969);
            fVar17 = 0.0;
            if (0.0 <= fVar19) {
              fVar17 = fVar19;
            }
            auVar15._4_4_ = fVar16 * -0.130257 + fVar2 * -0.012033211;
            auVar15._0_4_ = (fVar16 * 1.705052 - fVar18) + fVar2 * -0.083258;
            auVar15._8_4_ = (0.0 - fVar18) + fVar2 * 0.0;
            auVar15._12_4_ = (0.0 - fVar18) + fVar2 * 0.0;
            auVar15 = maxps(ZEXT816(0),auVar15);
            *(long *)((long)pfVar10 + lVar8 + -0xc) = auVar15._0_8_;
            *(float *)((long)pfVar10 + lVar8 + -4) = fVar17;
            *(undefined4 *)((long)pfVar10 + lVar8) = uVar3;
            lVar8 = lVar8 + 0x10;
            sVar14 = sVar14 - 1;
          } while (sVar14 != 0);
          sVar13 = sVar13 + 1;
          pfVar10 = pfVar10 + width * 4;
          pfVar9 = pfVar9 + width * 4;
        } while (sVar13 != height);
        return true;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<(poVar1,0x3b7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"Input buffer size must be {}, but got {}","");
      local_1b8 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2;
      local_1b0._0_8_ = pcVar11;
      fmt::format<unsigned_long,unsigned_long>
                (&local_208,(fmt *)&local_1e0,(string *)local_1b0,&local_1b8,
                 (unsigned_long *)out_img);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      psVar6 = local_1e8;
      if (local_1e8 == (string *)0x0) goto LAB_0044eeb4;
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)psVar6,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_0044eeb4;
    }
  }
  operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
LAB_0044eeb4:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ACEScg_to_linear_sRGB(const std::vector<float> &in_img, size_t width,
                         size_t height, size_t channels,
                         std::vector<float> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if ((channels != 3) && (channels != 4)) {
    PUSH_ERROR_AND_RETURN(fmt::format("channels must be 3 or 4, but got {}", channels));
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }


  if (in_img.size() != (width * height * channels)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Input buffer size must be {}, but got {}", (width * height * channels), in_img.size()));
  }

  out_img->resize(in_img.size());

  // inv(ACEScg_to_lin_sRGB)
  // 
  // https://www.shadertoy.com/view/WltSRB

  if (channels == 3) {
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b;
        r = in_img[3 * (y * width + x) + 0];
        g = in_img[3 * (y * width + x) + 1];
        b = in_img[3 * (y * width + x) + 2];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[3 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[3 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[3 * (y * width + x) + 2] = out_rgb[2];
      }
    }

  } else { // rgba
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b, a;
        r = in_img[4 * (y * width + x) + 0];
        g = in_img[4 * (y * width + x) + 1];
        b = in_img[4 * (y * width + x) + 2];
        a = in_img[4 * (y * width + x) + 3];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative value
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[4 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[4 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[4 * (y * width + x) + 2] = out_rgb[2];
        (*out_img)[4 * (y * width + x) + 3] = a;
      }
    }
  }

  return true;
}